

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O1

axbStatus_t axbVecAXPY(axbVec_s *y,axbScalar_s *alpha,axbVec_s *x)

{
  if (x->init == 0x1d232) {
    if (y->init == 0x1d232) {
      (*y->opBackend->op_table[0x10].func)();
      return 0;
    }
    axbVecAXPY_cold_2();
  }
  else {
    axbVecAXPY_cold_1();
  }
  return 0x1d232;
}

Assistant:

axbStatus_t axbVecAXPY(struct axbVec_s *y, const struct axbScalar_s *alpha, const struct axbVec_s *x)
{
  AXB_VECTOR_INIT_CHECK(x);
  AXB_VECTOR_INIT_CHECK(y);

  axbOpDescriptor_t op_desc = y->opBackend->op_table[AXB_OP_VEC_AXPY];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbScalar_s *, const struct axbVec_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbScalar_s *, const struct axbVec_s *, void*)) op_desc.func;
  op(y, alpha, x, op_desc.func_data);
  return 0;
}